

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

void duckdb::QuantileOperation::
     ConstantOperation<short,duckdb::QuantileState<short,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
               (QuantileState<short,_duckdb::QuantileStandardType> *state,short *input,
               AggregateUnaryInput *unary_input,idx_t count)

{
  QuantileState<short,_duckdb::QuantileStandardType> *in_RCX;
  idx_t i;
  QuantileState<short,_duckdb::QuantileStandardType> *input_00;
  
  for (input_00 = (QuantileState<short,_duckdb::QuantileStandardType> *)0x0; input_00 < in_RCX;
      input_00 = (QuantileState<short,_duckdb::QuantileStandardType> *)
                 ((long)&(input_00->v).super_vector<short,_std::allocator<short>_>.
                         super__Vector_base<short,_std::allocator<short>_>._M_impl.
                         super__Vector_impl_data._M_start + 1)) {
    Operation<short,duckdb::QuantileState<short,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
              (in_RCX,(short *)input_00,(AggregateUnaryInput *)0xa065af);
  }
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input,
	                              idx_t count) {
		for (idx_t i = 0; i < count; i++) {
			Operation<INPUT_TYPE, STATE, OP>(state, input, unary_input);
		}
	}